

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderTimestamp
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  StringPiece error_message;
  StringPiece error_message_00;
  bool bVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  AlphaNum *in_RCX;
  AlphaNum *b;
  StringPiece name;
  StringPiece SVar4;
  StringPiece local_d8;
  _Alloc_hider _Stack_a8;
  int64 seconds;
  string local_88;
  DataPiece local_68;
  int32 local_34 [2];
  int32 nanos;
  
  if (data->type_ == TYPE_STRING) {
    SVar4 = DataPiece::str(data);
    pcVar2 = SVar4.ptr_;
    local_68._vptr_DataPiece = (_func_int **)&local_68.field_2;
    if (pcVar2 == (char *)0x0) {
      local_68.type_ = 0;
      local_68._12_4_ = 0;
      local_68.field_2.u64_ = local_68.field_2.u64_ & 0xffffffffffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,pcVar2,pcVar2 + SVar4.length_);
    }
    bVar1 = protobuf::internal::ParseTime
                      ((string *)&local_68,(int64 *)&stack0xffffffffffffff58,local_34);
    if ((anon_union_16_8_b72e7a25_for_DataPiece_3 *)local_68._vptr_DataPiece != &local_68.field_2) {
      operator_delete(local_68._vptr_DataPiece);
    }
    if (bVar1) {
      local_68._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_68.type_ = TYPE_INT64;
      local_68.field_2.i64_ = (int64)_Stack_a8._M_p;
      local_68.use_strict_base64_decoding_ = false;
      SVar4.length_ = 7;
      SVar4.ptr_ = "seconds";
      ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,SVar4,&local_68);
      local_68._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      local_68.type_ = TYPE_INT32;
      local_68.field_2.i32_ = local_34[0];
      local_68.use_strict_base64_decoding_ = false;
      name.length_ = 5;
      name.ptr_ = "nanos";
      ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name,&local_68);
      goto LAB_0031c133;
    }
    local_68._vptr_DataPiece = (_func_int **)0x3550a8;
    local_68.type_ = 0x15;
    local_68._12_4_ = 0;
    local_d8 = SVar4;
    StrCat_abi_cxx11_(&local_88,(protobuf *)&local_68,(AlphaNum *)&local_d8,in_RCX);
    error_message_00.length_ = local_88._M_string_length;
    error_message_00.ptr_ = local_88._M_dataplus._M_p;
    if ((long)local_88._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_88._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message_00);
    paVar3 = &local_88.field_2;
  }
  else {
    if (data->type_ == TYPE_NULL) {
LAB_0031c133:
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_68._vptr_DataPiece = (_func_int **)0x35507d;
    local_68.type_ = 0x2a;
    local_68._12_4_ = 0;
    b = (AlphaNum *)0x0;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_
              ((string *)&stack0xffffffffffffff58,data,(StringPiece)ZEXT816(0x346c7c));
    local_d8.length_ = seconds;
    local_d8.ptr_ = _Stack_a8._M_p;
    StrCat_abi_cxx11_(&local_88,(protobuf *)&local_68,(AlphaNum *)&local_d8,b);
    error_message.length_ = local_88._M_string_length;
    error_message.ptr_ = local_88._M_dataplus._M_p;
    if ((long)local_88._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_88._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&stack0xffffffffffffff68;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderTimestamp(ProtoStreamObjectWriter* ow,
                                                const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for timestamp, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  StringPiece value(data.str());

  int64 seconds;
  int32 nanos;
  if (!::google::protobuf::internal::ParseTime(value.ToString(), &seconds,
                                               &nanos)) {
    return Status(INVALID_ARGUMENT, StrCat("Invalid time format: ", value));
  }


  ow->ProtoWriter::RenderDataPiece("seconds", DataPiece(seconds));
  ow->ProtoWriter::RenderDataPiece("nanos", DataPiece(nanos));
  return Status();
}